

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testLineAlgo.cpp
# Opt level: O0

void anon_unknown.dwarf_6c2d2::testClosestPoints(void)

{
  bool bVar1;
  ostream *poVar2;
  float fVar3;
  V3f n;
  float d;
  float e;
  bool rv;
  V3f point2;
  V3f point1;
  Line3f line2;
  Line3f line1;
  int i;
  Rand48 rand;
  Vec3<float> *in_stack_fffffffffffffc58;
  float in_stack_fffffffffffffc60;
  float in_stack_fffffffffffffc64;
  Vec3<float> *in_stack_fffffffffffffc68;
  float in_stack_fffffffffffffc70;
  float in_stack_fffffffffffffc74;
  undefined4 in_stack_fffffffffffffc78;
  float in_stack_fffffffffffffc7c;
  undefined1 in_stack_fffffffffffffc87;
  Line3f *in_stack_fffffffffffffc88;
  Line3f *in_stack_fffffffffffffc90;
  Vec3<float> *in_stack_fffffffffffffca0;
  Vec3<float> *in_stack_fffffffffffffca8;
  Line3<float> *in_stack_fffffffffffffcb0;
  Line3<float> *in_stack_fffffffffffffcb8;
  int local_2dc;
  Vec3<float> local_2d0;
  Vec3<float> local_2c4;
  Vec3<float> local_2b8;
  Vec3<float> local_2ac [3];
  Vec3<float> local_288;
  Vec3<float> local_27c [3];
  Vec3<float> local_258;
  Vec3<float> local_24c;
  Vec3<float> local_240;
  Vec3<float> local_234 [3];
  Vec3<float> local_210;
  Vec3<float> local_204 [3];
  Vec3<float> local_1e0;
  Vec3<float> local_1d4;
  Vec3<float> local_1c8;
  Vec3<float> local_1bc [3];
  Vec3<float> local_198;
  Vec3<float> local_18c [3];
  Vec3<float> local_168;
  Vec3<float> local_15c;
  Vec3<float> local_150;
  Vec3<float> local_144 [3];
  Vec3<float> local_120;
  Vec3<float> local_114 [3];
  Vec3<float> local_f0;
  Vec3<float> local_e4;
  Vec3<float> local_d8;
  Vec3<float> local_cc [3];
  Vec3<float> local_a8;
  Vec3<float> local_9c [3];
  Vec3<float> local_78;
  Vec3<float> local_6c;
  Vec3<float> local_60;
  Vec3<float> local_54 [3];
  Vec3<float> local_30;
  Vec3<float> local_24 [3];
  
  poVar2 = std::operator<<((ostream *)&std::cout,"closest points on two lines");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"  non-intersecting, non-parallel lines");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Vec3<float>::Vec3(local_24,0.0,-1.0,-1.0);
  Imath_3_2::Vec3<float>::Vec3(&local_30,0.0,1.0,-1.0);
  Imath_3_2::Line3<float>::Line3
            ((Line3<float> *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
             in_stack_fffffffffffffc68,
             (Vec3<float> *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
  Imath_3_2::Vec3<float>::Vec3(local_54,-1.0,0.0,1.0);
  Imath_3_2::Vec3<float>::Vec3(&local_60,1.0,0.0,1.0);
  Imath_3_2::Line3<float>::Line3
            ((Line3<float> *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
             in_stack_fffffffffffffc68,
             (Vec3<float> *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
  Imath_3_2::Vec3<float>::Vec3(&local_6c,0.0,0.0,-1.0);
  Imath_3_2::Vec3<float>::Vec3(&local_78,0.0,0.0,1.0);
  testClosestPoints(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                    (bool)in_stack_fffffffffffffc87,
                    (V3f *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                    (V3f *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
  Imath_3_2::Vec3<float>::Vec3(local_9c,2.0,-1.0,-1.0);
  Imath_3_2::Vec3<float>::Vec3(&local_a8,2.0,1.0,-1.0);
  Imath_3_2::Line3<float>::Line3
            ((Line3<float> *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
             in_stack_fffffffffffffc68,
             (Vec3<float> *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
  Imath_3_2::Vec3<float>::Vec3(local_cc,-1.0,3.0,1.0);
  Imath_3_2::Vec3<float>::Vec3(&local_d8,1.0,3.0,1.0);
  Imath_3_2::Line3<float>::Line3
            ((Line3<float> *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
             in_stack_fffffffffffffc68,
             (Vec3<float> *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
  Imath_3_2::Vec3<float>::Vec3(&local_e4,2.0,3.0,-1.0);
  Imath_3_2::Vec3<float>::Vec3(&local_f0,2.0,3.0,1.0);
  testClosestPoints(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                    (bool)in_stack_fffffffffffffc87,
                    (V3f *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                    (V3f *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
  poVar2 = std::operator<<((ostream *)&std::cout,"  intersecting, non-parallel lines");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Vec3<float>::Vec3(local_114,2.0,-1.0,0.0);
  Imath_3_2::Vec3<float>::Vec3(&local_120,2.0,1.0,0.0);
  Imath_3_2::Line3<float>::Line3
            ((Line3<float> *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
             in_stack_fffffffffffffc68,
             (Vec3<float> *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
  Imath_3_2::Vec3<float>::Vec3(local_144,-1.0,3.0,0.0);
  Imath_3_2::Vec3<float>::Vec3(&local_150,1.0,3.0,0.0);
  Imath_3_2::Line3<float>::Line3
            ((Line3<float> *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
             in_stack_fffffffffffffc68,
             (Vec3<float> *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
  Imath_3_2::Vec3<float>::Vec3(&local_15c,2.0,3.0,0.0);
  Imath_3_2::Vec3<float>::Vec3(&local_168,2.0,3.0,0.0);
  testClosestPoints(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                    (bool)in_stack_fffffffffffffc87,
                    (V3f *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                    (V3f *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
  poVar2 = std::operator<<((ostream *)&std::cout,"  parallel lines");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Vec3<float>::Vec3(local_18c,2.0,-1.0,0.0);
  Imath_3_2::Vec3<float>::Vec3(&local_198,2.0,1.0,0.0);
  Imath_3_2::Line3<float>::Line3
            ((Line3<float> *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
             in_stack_fffffffffffffc68,
             (Vec3<float> *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
  Imath_3_2::Vec3<float>::Vec3(local_1bc,2.0,-1.0,1.0);
  Imath_3_2::Vec3<float>::Vec3(&local_1c8,2.0,1.0,1.0);
  Imath_3_2::Line3<float>::Line3
            ((Line3<float> *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
             in_stack_fffffffffffffc68,
             (Vec3<float> *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
  Imath_3_2::Vec3<float>::Vec3(&local_1d4,0.0,0.0,0.0);
  Imath_3_2::Vec3<float>::Vec3(&local_1e0,0.0,0.0,0.0);
  testClosestPoints(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                    (bool)in_stack_fffffffffffffc87,
                    (V3f *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                    (V3f *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
  Imath_3_2::Vec3<float>::Vec3(local_204,2.0,-1.0,0.0);
  Imath_3_2::Vec3<float>::Vec3(&local_210,2.0,1.0,0.0);
  Imath_3_2::Line3<float>::Line3
            ((Line3<float> *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
             in_stack_fffffffffffffc68,
             (Vec3<float> *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
  Imath_3_2::Vec3<float>::Vec3(local_234,2.0,1.0,1.0);
  Imath_3_2::Vec3<float>::Vec3(&local_240,2.0,-1.0,1.0);
  Imath_3_2::Line3<float>::Line3
            ((Line3<float> *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
             in_stack_fffffffffffffc68,
             (Vec3<float> *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
  Imath_3_2::Vec3<float>::Vec3(&local_24c,0.0,0.0,0.0);
  Imath_3_2::Vec3<float>::Vec3(&local_258,0.0,0.0,0.0);
  testClosestPoints(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                    (bool)in_stack_fffffffffffffc87,
                    (V3f *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                    (V3f *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
  poVar2 = std::operator<<((ostream *)&std::cout,"  coincident lines");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Vec3<float>::Vec3(local_27c,2.0,-1.0,0.0);
  Imath_3_2::Vec3<float>::Vec3(&local_288,2.0,-1.0,1.0);
  Imath_3_2::Line3<float>::Line3
            ((Line3<float> *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
             in_stack_fffffffffffffc68,
             (Vec3<float> *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
  Imath_3_2::Vec3<float>::Vec3(local_2ac,2.0,-1.0,0.0);
  Imath_3_2::Vec3<float>::Vec3(&local_2b8,2.0,-1.0,1.0);
  Imath_3_2::Line3<float>::Line3
            ((Line3<float> *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
             in_stack_fffffffffffffc68,
             (Vec3<float> *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
  Imath_3_2::Vec3<float>::Vec3(&local_2c4,0.0,0.0,0.0);
  Imath_3_2::Vec3<float>::Vec3(&local_2d0,0.0,0.0,0.0);
  testClosestPoints(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                    (bool)in_stack_fffffffffffffc87,
                    (V3f *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                    (V3f *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
  poVar2 = std::operator<<((ostream *)&std::cout,"  random lines");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Rand48::Rand48
            ((Rand48 *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
             (unsigned_long)in_stack_fffffffffffffc58);
  local_2dc = 0;
  do {
    if (9999 < local_2dc) {
      return;
    }
    Imath_3_2::solidSphereRand<Imath_3_2::Vec3<float>,Imath_3_2::Rand48>
              ((Rand48 *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
    Imath_3_2::Vec3<float>::operator*(in_stack_fffffffffffffc68,in_stack_fffffffffffffc64);
    Imath_3_2::solidSphereRand<Imath_3_2::Vec3<float>,Imath_3_2::Rand48>
              ((Rand48 *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
    Imath_3_2::Vec3<float>::operator*(in_stack_fffffffffffffc68,in_stack_fffffffffffffc64);
    Imath_3_2::Line3<float>::Line3
              ((Line3<float> *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
               in_stack_fffffffffffffc68,
               (Vec3<float> *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
    Imath_3_2::solidSphereRand<Imath_3_2::Vec3<float>,Imath_3_2::Rand48>
              ((Rand48 *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
    Imath_3_2::Vec3<float>::operator*(in_stack_fffffffffffffc68,in_stack_fffffffffffffc64);
    Imath_3_2::solidSphereRand<Imath_3_2::Vec3<float>,Imath_3_2::Rand48>
              ((Rand48 *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
    Imath_3_2::Vec3<float>::operator*(in_stack_fffffffffffffc68,in_stack_fffffffffffffc64);
    Imath_3_2::Line3<float>::Line3
              ((Line3<float> *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
               in_stack_fffffffffffffc68,
               (Vec3<float> *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
    Imath_3_2::Vec3<float>::Vec3((Vec3<float> *)&stack0xfffffffffffffc88);
    Imath_3_2::Vec3<float>::Vec3((Vec3<float> *)&stack0xfffffffffffffc7c);
    bVar1 = Imath_3_2::closestPoints<float>
                      (in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8
                       ,in_stack_fffffffffffffca0);
    in_stack_fffffffffffffc78 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffc78);
    if (bVar1) {
      in_stack_fffffffffffffc74 = std::numeric_limits<float>::epsilon();
      in_stack_fffffffffffffc74 = in_stack_fffffffffffffc74 * 2000.0;
      in_stack_fffffffffffffc60 =
           Imath_3_2::Vec3<float>::operator^
                     ((Vec3<float> *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                      in_stack_fffffffffffffc58);
      fVar3 = Imath_3_2::Vec3<float>::operator^
                        ((Vec3<float> *)
                         CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                         in_stack_fffffffffffffc58);
      in_stack_fffffffffffffc70 = -in_stack_fffffffffffffc60 * fVar3 + 1.0;
      Imath_3_2::Vec3<float>::operator-
                (in_stack_fffffffffffffc68,
                 (Vec3<float> *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
      fVar3 = Imath_3_2::Vec3<float>::operator^
                        ((Vec3<float> *)
                         CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                         in_stack_fffffffffffffc58);
      bVar1 = Imath_3_2::equalWithAbsError<float>
                        (0.0,fVar3 * in_stack_fffffffffffffc70,in_stack_fffffffffffffc74);
      if (!bVar1) {
        __assert_fail("equalWithAbsError (0.0f, (line1.dir ^ n) * d, e)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testLineAlgo.cpp"
                      ,0x87,"void (anonymous namespace)::testClosestPoints()");
      }
      fVar3 = Imath_3_2::Vec3<float>::operator^
                        ((Vec3<float> *)
                         CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                         in_stack_fffffffffffffc58);
      bVar1 = Imath_3_2::equalWithAbsError<float>
                        (0.0,fVar3 * in_stack_fffffffffffffc70,in_stack_fffffffffffffc74);
      if (!bVar1) {
        __assert_fail("equalWithAbsError (0.0f, (line2.dir ^ n) * d, e)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testLineAlgo.cpp"
                      ,0x88,"void (anonymous namespace)::testClosestPoints()");
      }
    }
    local_2dc = local_2dc + 1;
  } while( true );
}

Assistant:

void
testClosestPoints ()
{
    cout << "closest points on two lines" << endl;

    cout << "  non-intersecting, non-parallel lines" << endl;

    testClosestPoints (
        Line3f (V3f (0, -1, -1), V3f (0, 1, -1)),
        Line3f (V3f (-1, 0, 1), V3f (1, 0, 1)),
        true,
        V3f (0, 0, -1),
        V3f (0, 0, 1));

    testClosestPoints (
        Line3f (V3f (2, -1, -1), V3f (2, 1, -1)),
        Line3f (V3f (-1, 3, 1), V3f (1, 3, 1)),
        true,
        V3f (2, 3, -1),
        V3f (2, 3, 1));

    cout << "  intersecting, non-parallel lines" << endl;

    testClosestPoints (
        Line3f (V3f (2, -1, 0), V3f (2, 1, 0)),
        Line3f (V3f (-1, 3, 0), V3f (1, 3, 0)),
        true,
        V3f (2, 3, 0),
        V3f (2, 3, 0));

    cout << "  parallel lines" << endl;

    testClosestPoints (
        Line3f (V3f (2, -1, 0), V3f (2, 1, 0)),
        Line3f (V3f (2, -1, 1), V3f (2, 1, 1)),
        false,
        V3f (0, 0, 0),
        V3f (0, 0, 0));

    testClosestPoints (
        Line3f (V3f (2, -1, 0), V3f (2, 1, 0)),
        Line3f (V3f (2, 1, 1), V3f (2, -1, 1)),
        false,
        V3f (0, 0, 0),
        V3f (0, 0, 0));

    cout << "  coincident lines" << endl;

    testClosestPoints (
        Line3f (V3f (2, -1, 0), V3f (2, -1, 1)),
        Line3f (V3f (2, -1, 0), V3f (2, -1, 1)),
        false,
        V3f (0, 0, 0),
        V3f (0, 0, 0));

    cout << "  random lines" << endl;

    Rand48 rand (7);

    for (int i = 0; i < 10000; ++i)
    {
        Line3f line1 (
            solidSphereRand<V3f> (rand) * 100.f,
            solidSphereRand<V3f> (rand) * 100.f);

        Line3f line2 (
            solidSphereRand<V3f> (rand) * 100.f,
            solidSphereRand<V3f> (rand) * 100.f);

        V3f  point1;
        V3f  point2;
        bool rv = closestPoints (line1, line2, point1, point2);

        if (rv)
        {
            //
            // We test if the line that connects point1 and point2
            // is perpendicular to line1 and line2.  The numerical
            // accuracy of point1 and point2 depends strongly on
            // the relative directions of line1 and line2; accuracy
            // degrades rather quickly if line1 and line2 become
            // close to parallel.
            //

            float e = 2000 * std::numeric_limits<float>::epsilon ();
            float d = 1 - (line1.dir ^ line2.dir) * (line1.dir ^ line2.dir);
            V3f   n = point1 - point2;

            assert (equalWithAbsError (0.0f, (line1.dir ^ n) * d, e));
            assert (equalWithAbsError (0.0f, (line2.dir ^ n) * d, e));
        }
    }
}